

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O1

ktx_error_code_e ktxHashListEntry_GetValue(ktxHashListEntry *This,uint *pValueLen,void **ppValue)

{
  ktx_error_code_e kVar1;
  void *pvVar2;
  
  kVar1 = KTX_INVALID_VALUE;
  if (ppValue != (void **)0x0 && pValueLen != (uint *)0x0) {
    *pValueLen = This->valueLen;
    kVar1 = KTX_SUCCESS;
    if (This->valueLen == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = This->value;
    }
    *ppValue = pvVar2;
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetValue(ktxHashListEntry* This,
                          unsigned int* pValueLen, void** ppValue)
{
    if (pValueLen && ppValue) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pValueLen = kv->valueLen;
        *ppValue = kv->valueLen > 0 ? kv->value : NULL;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}